

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase435::run(TestCase435 *this)

{
  __pid_t _Var1;
  ForkedPromise<int> *pFVar2;
  __pid_t local_108;
  int local_104;
  bool local_fd;
  __pid_t local_fc;
  int iStack_f8;
  bool _kj_shouldLog_1;
  bool local_f1;
  undefined1 local_f0 [7];
  bool _kj_shouldLog;
  ForkedPromise<int> releaseFork;
  ForkedPromise<int> local_d8;
  undefined1 local_c8 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:447:40),_int>
  branch2;
  ForkedPromise<int> local_b0;
  undefined1 local_a0 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:443:40),_int>
  branch1;
  ForkedPromise<int> fork;
  undefined1 local_78 [8];
  Promise<int> promise;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase435 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  evalLater<kj::(anonymous_namespace)::TestCase435::run()::__0>
            ((kj *)local_78,(Type *)((long)&fork.hub.ptr + 7));
  Promise<int>::fork((Promise<int> *)&branch1.super_PromiseBase.node.ptr);
  ForkedPromise<int>::addBranch(&local_b0);
  Promise<int>::then<kj::(anonymous_namespace)::TestCase435::run()::__1,kj::_::PropagateException>
            ((Promise<int> *)local_a0,(Type *)&local_b0,
             (PropagateException *)((long)&branch2.super_PromiseBase.node.ptr + 7));
  Promise<int>::~Promise((Promise<int> *)&local_b0);
  ForkedPromise<int>::addBranch(&local_d8);
  Promise<int>::then<kj::(anonymous_namespace)::TestCase435::run()::__2,kj::_::PropagateException>
            ((Promise<int> *)local_c8,(Type *)&local_d8,
             (PropagateException *)((long)&releaseFork.hub.ptr + 7));
  Promise<int>::~Promise((Promise<int> *)&local_d8);
  pFVar2 = mv<kj::ForkedPromise<int>>((ForkedPromise<int> *)&branch1.super_PromiseBase.node.ptr);
  ForkedPromise<int>::ForkedPromise((ForkedPromise<int> *)local_f0,pFVar2);
  ForkedPromise<int>::~ForkedPromise((ForkedPromise<int> *)local_f0);
  _Var1 = Promise<int>::wait((Promise<int> *)local_a0,local_58);
  if (_Var1 != 0x1c8) {
    local_f1 = _::Debug::shouldLog(ERROR);
    while (local_f1 != false) {
      iStack_f8 = 0x1c8;
      local_fc = Promise<int>::wait((Promise<int> *)local_a0,local_58);
      _::Debug::log<char_const(&)[52],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x1c8,ERROR,
                 "\"failed: expected \" \"(456) == (branch1.wait(waitScope))\", 456, branch1.wait(waitScope)"
                 ,(char (*) [52])"failed: expected (456) == (branch1.wait(waitScope))",
                 &stack0xffffffffffffff08,&local_fc);
      local_f1 = false;
    }
  }
  _Var1 = Promise<int>::wait((Promise<int> *)local_c8,local_58);
  if (_Var1 != 0x315) {
    local_fd = _::Debug::shouldLog(ERROR);
    while (local_fd != false) {
      local_104 = 0x315;
      local_108 = Promise<int>::wait((Promise<int> *)local_c8,local_58);
      _::Debug::log<char_const(&)[52],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x1c9,ERROR,
                 "\"failed: expected \" \"(789) == (branch2.wait(waitScope))\", 789, branch2.wait(waitScope)"
                 ,(char (*) [52])"failed: expected (789) == (branch2.wait(waitScope))",&local_104,
                 &local_108);
      local_fd = false;
    }
  }
  Promise<int>::~Promise((Promise<int> *)local_c8);
  Promise<int>::~Promise((Promise<int> *)local_a0);
  ForkedPromise<int>::~ForkedPromise((ForkedPromise<int> *)&branch1.super_PromiseBase.node.ptr);
  Promise<int>::~Promise((Promise<int> *)local_78);
  WaitScope::~WaitScope((WaitScope *)local_58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, Fork) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() { return 123; });

  auto fork = promise.fork();

  auto branch1 = fork.addBranch().then([](int i) {
    EXPECT_EQ(123, i);
    return 456;
  });
  auto branch2 = fork.addBranch().then([](int i) {
    EXPECT_EQ(123, i);
    return 789;
  });

  {
    auto releaseFork = kj::mv(fork);
  }

  EXPECT_EQ(456, branch1.wait(waitScope));
  EXPECT_EQ(789, branch2.wait(waitScope));
}